

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit_library.cpp
# Opt level: O0

void __thiscall
lsim::ModelCircuitLibrary::ModelCircuitLibrary(ModelCircuitLibrary *this,char *name,char *path)

{
  char *pcVar1;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *path_local;
  char *name_local;
  ModelCircuitLibrary *this_local;
  
  local_20 = path;
  path_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,name,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_path,pcVar1,local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  std::
  vector<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
  ::vector(&this->m_circuits);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*>_>_>
  ::unordered_map(&this->m_circuit_lut);
  std::__cxx11::string::string((string *)&this->m_main_circuit);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_references);
  return;
}

Assistant:

ModelCircuitLibrary::ModelCircuitLibrary(const char *name, const char *path) :
        m_name(name),
        m_path(path) {
}